

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
             *this,truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it)

{
  wchar_t wVar1;
  long lVar2;
  ulong uVar3;
  wchar_t wVar4;
  ulong uVar5;
  wchar_t *pwVar6;
  ulong uVar7;
  wchar_t wVar8;
  char *pcVar9;
  long lVar10;
  
  lVar2 = *(long *)(this + 0x10);
  pwVar6 = (it->super_truncating_iterator_base<wchar_t_*>).out_;
  uVar3 = (it->super_truncating_iterator_base<wchar_t_*>).limit_;
  uVar5 = (it->super_truncating_iterator_base<wchar_t_*>).count_;
  wVar8 = it->blackhole_;
  if (lVar2 != 0) {
    if (0 < lVar2) {
      pcVar9 = *(char **)(this + 8);
      lVar10 = lVar2 + 1;
      uVar7 = uVar5;
      do {
        wVar1 = (int)*pcVar9;
        if (uVar7 < uVar3) {
          *pwVar6 = (int)*pcVar9;
          pwVar6 = pwVar6 + 1;
          wVar1 = wVar8;
        }
        wVar8 = wVar1;
        uVar7 = uVar7 + 1;
        pcVar9 = pcVar9 + 1;
        lVar10 = lVar10 + -1;
      } while (1 < lVar10);
      uVar5 = uVar5 + lVar2;
    }
    (it->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar6;
    (it->super_truncating_iterator_base<wchar_t_*>).limit_ = uVar3;
    (it->super_truncating_iterator_base<wchar_t_*>).count_ = uVar5;
    it->blackhole_ = wVar8;
  }
  lVar2 = *(long *)(this + 0x20);
  if (lVar2 != 0) {
    wVar1 = *(wchar_t *)(this + 0x18);
    lVar10 = lVar2;
    uVar7 = uVar5;
    do {
      wVar4 = wVar1;
      if (uVar7 < uVar3) {
        *pwVar6 = wVar1;
        pwVar6 = pwVar6 + 1;
        wVar4 = wVar8;
      }
      wVar8 = wVar4;
      uVar7 = uVar7 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
    uVar5 = uVar5 + lVar2;
  }
  (it->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar6;
  (it->super_truncating_iterator_base<wchar_t_*>).limit_ = uVar3;
  (it->super_truncating_iterator_base<wchar_t_*>).count_ = uVar5;
  it->blackhole_ = wVar8;
  int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::dec_writer::operator()
            ((dec_writer *)(this + 0x28),it);
  return;
}

Assistant:

inline T *make_checked(T *p, std::size_t) { return p; }